

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O0

bool __thiscall
re2::Regexp::ParseState::PushRepetition
          (ParseState *this,int min,int max,StringPiece *s,bool nongreedy)

{
  bool bVar1;
  RegexpOp op;
  int iVar2;
  Regexp *this_00;
  Regexp *pRVar3;
  Regexp **ppRVar4;
  undefined1 local_60 [8];
  RepetitionWalker w;
  Regexp *re;
  ParseFlags fl;
  bool nongreedy_local;
  StringPiece *s_local;
  int max_local;
  int min_local;
  ParseState *this_local;
  
  if ((((max == -1) || (min <= max)) && (min < 0x3e9)) && (max < 0x3e9)) {
    if (this->stacktop_ != (Regexp *)0x0) {
      op = Regexp::op(this->stacktop_);
      bVar1 = IsMarker(this,op);
      if (!bVar1) {
        re._0_4_ = this->flags_;
        if (nongreedy) {
          re._0_4_ = operator^((ParseFlags)re,NonGreedy);
        }
        this_00 = (Regexp *)operator_new(0x28);
        Regexp(this_00,kRegexpRepeat,(ParseFlags)re);
        (this_00->field_7).field_0.min_ = min;
        (this_00->field_7).field_0.max_ = max;
        AllocSub(this_00,1);
        this_00->down_ = this->stacktop_->down_;
        pRVar3 = FinishRegexp(this,this->stacktop_);
        ppRVar4 = Regexp::sub(this_00);
        *ppRVar4 = pRVar3;
        bVar1 = ComputeSimple(this_00);
        this_00->simple_ = bVar1;
        this->stacktop_ = this_00;
        if ((1 < min) || (1 < max)) {
          RepetitionWalker::RepetitionWalker((RepetitionWalker *)local_60);
          iVar2 = Walker<int>::Walk((Walker<int> *)local_60,this->stacktop_,1000);
          if (iVar2 == 0) {
            RegexpStatus::set_code(this->status_,kRegexpRepeatSize);
            RegexpStatus::set_error_arg(this->status_,s);
            this_local._7_1_ = 0;
          }
          RepetitionWalker::~RepetitionWalker((RepetitionWalker *)local_60);
          if (iVar2 == 0) goto LAB_00158481;
        }
        this_local._7_1_ = 1;
        goto LAB_00158481;
      }
    }
    RegexpStatus::set_code(this->status_,kRegexpRepeatArgument);
    RegexpStatus::set_error_arg(this->status_,s);
    this_local._7_1_ = 0;
  }
  else {
    RegexpStatus::set_code(this->status_,kRegexpRepeatSize);
    RegexpStatus::set_error_arg(this->status_,s);
    this_local._7_1_ = 0;
  }
LAB_00158481:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool Regexp::ParseState::PushRepetition(int min, int max,
                                        const StringPiece& s,
                                        bool nongreedy) {
  if ((max != -1 && max < min) || min > 1000 || max > 1000) {
    status_->set_code(kRegexpRepeatSize);
    status_->set_error_arg(s);
    return false;
  }
  if (stacktop_ == NULL || IsMarker(stacktop_->op())) {
    status_->set_code(kRegexpRepeatArgument);
    status_->set_error_arg(s);
    return false;
  }
  Regexp::ParseFlags fl = flags_;
  if (nongreedy)
    fl = fl ^ NonGreedy;
  Regexp* re = new Regexp(kRegexpRepeat, fl);
  re->min_ = min;
  re->max_ = max;
  re->AllocSub(1);
  re->down_ = stacktop_->down_;
  re->sub()[0] = FinishRegexp(stacktop_);
  re->simple_ = re->ComputeSimple();
  stacktop_ = re;
  if (min >= 2 || max >= 2) {
    RepetitionWalker w;
    if (w.Walk(stacktop_, 1000) == 0) {
      status_->set_code(kRegexpRepeatSize);
      status_->set_error_arg(s);
      return false;
    }
  }
  return true;
}